

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFMethod::selectMolecule(SPFMethod *this)

{
  pointer *ppOVar1;
  int iVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  bool bVar5;
  long *plVar6;
  uint uVar7;
  long *plVar8;
  ulong uVar9;
  uint __len;
  long lVar10;
  shared_ptr<OpenMD::SPFData> spfData;
  long local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr<OpenMD::SPFData> local_90;
  shared_ptr<OpenMD::SPFData> local_80;
  long *local_70 [2];
  long local_60 [2];
  SelectionSet local_50;
  long lStack_38;
  
  Snapshot::getSPFData((this->super_RNEMD).currentSnap_);
  this->spfTarget_ = (this->super_RNEMD).particleTarget_;
  iVar2 = *(int *)(local_a0 + 0x20);
  if (iVar2 == -1) {
    local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    bVar5 = setSelectedMolecule(this,&local_80);
  }
  else {
    local_90.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_98;
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_98->_M_use_count = local_98->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_98->_M_use_count = local_98->_M_use_count + 1;
      }
    }
    bVar5 = true;
    getSelectedMolecule(this,&local_90);
  }
  if (iVar2 != -1) {
    local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_90.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if (local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (bVar5 == false) {
    this->failedLastTrial_ = true;
  }
  else {
    uVar3 = *(uint *)(local_a0 + 0x20);
    __val = -uVar3;
    if (0 < (int)uVar3) {
      __val = uVar3;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar4 = 4;
      do {
        __len = uVar4;
        uVar7 = (uint)uVar9;
        if (uVar7 < 100) {
          __len = __len - 2;
          goto LAB_00280b70;
        }
        if (uVar7 < 1000) {
          __len = __len - 1;
          goto LAB_00280b70;
        }
        if (uVar7 < 10000) goto LAB_00280b70;
        uVar9 = uVar9 / 10000;
        uVar4 = __len + 4;
      } while (99999 < uVar7);
      __len = __len + 1;
    }
LAB_00280b70:
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)((int)uVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_70[0]),__len,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x2abae9);
    ppOVar1 = &local_50.bitsets_.
               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    plVar8 = plVar6 + 2;
    if ((pointer *)*plVar6 == (pointer *)plVar8) {
      local_50.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
      lStack_38 = plVar6[3];
      local_50.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppOVar1;
    }
    else {
      local_50.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar8;
      local_50.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar6;
    }
    local_50.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->selectedMoleculeStr_,(string *)&local_50);
    if (local_50.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppOVar1) {
      operator_delete(local_50.bitsets_.
                      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((local_50.bitsets_.
                                       super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->bitset_)
                                     .super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                             + 1));
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    SelectionEvaluator::loadScriptString
              (&this->selectedMoleculeEvaluator_,&this->selectedMoleculeStr_);
    SelectionEvaluator::evaluate(&local_50,&this->selectedMoleculeEvaluator_);
    lVar10 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar10),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)local_50.bitsets_.
                        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar10));
      lVar10 = lVar10 + 0x28;
    } while (lVar10 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              (&local_50.bitsets_);
  }
  this->forceManager_->hasSelectedMolecule_ = bVar5;
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

void SPFMethod::selectMolecule() {
    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    // Always reset spfTarget_ before selecting a new particle
    spfTarget_ = particleTarget_;

    bool hasSelectedMolecule = (spfData->globalID == -1) ?
                                   setSelectedMolecule(spfData) :
                                   getSelectedMolecule(spfData);

    if (hasSelectedMolecule) {
      selectedMoleculeStr_ = "select " + std::to_string(spfData->globalID);

      selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
      selectedMoleculeMan_.setSelectionSet(
          selectedMoleculeEvaluator_.evaluate());

#ifdef IS_MPI
      MPI_Bcast(&spfTarget_, 1, MPI_REALTYPE,
                info_->getMolToProc(spfData->globalID), MPI_COMM_WORLD);
#endif
    } else {
      failedLastTrial_ = true;
    }

    forceManager_->setHasSelectedMolecule(hasSelectedMolecule);
  }